

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_2::SequentialFileImpl::Skip(SequentialFileImpl *this,uint64_t n)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong in_RDX;
  Slice local_40;
  Slice local_30;
  
  uVar2 = *(ulong *)(n + 0x10);
  uVar1 = FileState::Size(*(FileState **)(n + 8));
  if (uVar1 < uVar2) {
    local_30.data_ = "pos_ > file_->Size()";
    local_30.size_ = 0x14;
    local_40.data_ = "";
    local_40.size_ = 0;
    Status::Status((Status *)this,kIOError,&local_30,&local_40);
  }
  else {
    uVar1 = FileState::Size(*(FileState **)(n + 8));
    uVar2 = uVar1 - *(long *)(n + 0x10);
    if (in_RDX <= uVar2) {
      uVar2 = in_RDX;
    }
    *(ulong *)(n + 0x10) = uVar2 + *(long *)(n + 0x10);
    (this->super_SequentialFile)._vptr_SequentialFile = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status Skip(uint64_t n) override {
    if (pos_ > file_->Size()) {
      return Status::IOError("pos_ > file_->Size()");
    }
    const uint64_t available = file_->Size() - pos_;
    if (n > available) {
      n = available;
    }
    pos_ += n;
    return Status::OK();
  }